

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaWriteVer.c
# Opt level: O3

void Prs_ManWriteVerilog(char *pFileName,Vec_Ptr_t *vPrs)

{
  int iVar1;
  Prs_Ntk_t *p;
  Vec_Int_t *pVVar2;
  Vec_Int_t *pVVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  uint uVar6;
  FILE *__stream;
  char *pcVar7;
  char *pcVar8;
  Vec_Str_t *p_00;
  long lVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  int *piVar15;
  uint uVar16;
  long lVar17;
  undefined1 auVar18 [16];
  char *pTypeNames [90];
  Vec_Int_t *local_348;
  long lStack_340;
  Vec_Int_t *local_338;
  long lStack_330;
  Vec_Int_t *local_328;
  long lStack_320;
  Vec_Int_t *local_318;
  long lStack_310;
  undefined8 local_308 [8];
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_50;
  char *local_48;
  char *local_40;
  
  if (vPrs->nSize < 1) {
    piVar15 = (int *)0x0;
  }
  else {
    piVar15 = (int *)*vPrs->pArray;
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open output file \"%s\".\n",pFileName);
    return;
  }
  memset(local_308,0,0x2b8);
  local_48 = "sli";
  local_40 = "icc";
  local_2c8 = "";
  local_2c0 = "~";
  local_2b8 = "&";
  local_2b0 = "&";
  local_2a8 = "|";
  local_2a0 = "|";
  local_298 = "^";
  local_290 = "^";
  local_288 = "&";
  local_280 = "&";
  local_278 = "?";
  local_270 = "maj";
  local_230 = "&";
  local_228 = "~&";
  local_220 = "|";
  local_218 = "~|";
  local_210 = "^";
  local_208 = "~^";
  local_200 = "!";
  local_1f8 = "&&";
  local_1f0 = "logic nand";
  local_1e8 = "||";
  local_1e0 = "logic nor";
  local_1d8 = "^^";
  local_1d0 = "logic xnor";
  local_1c8 = "nmux";
  local_1c0 = "sel";
  local_1b8 = "prio-select";
  local_1b0 = "enc";
  local_1a8 = "prio-enc";
  local_1a0 = "dec";
  local_198 = "enable-dec";
  local_190 = "+";
  local_188 = "-";
  local_180 = "*";
  local_170 = "/";
  local_168 = "%";
  local_160 = "%";
  local_158 = "**";
  local_150 = "-";
  local_148 = "@";
  local_140 = "abs";
  local_130 = "<";
  local_128 = "<=";
  local_120 = ">=";
  local_118 = ">";
  local_110 = "==";
  local_108 = "!=";
  local_100 = "<<";
  local_f8 = ">>";
  local_f0 = "<<<";
  local_e8 = ">>>";
  local_e0 = "rotL";
  local_d8 = "rotR";
  local_b0 = "tri";
  local_a8 = "ram";
  local_a0 = "ramR";
  local_98 = "ramW";
  local_90 = "ramWC";
  local_78 = "ramBox";
  local_70 = "lat";
  local_68 = "latrs";
  local_60 = "dff";
  local_50 = "dffrs";
  pcVar7 = Abc_NamStr(*(Abc_Nam_t **)(piVar15 + 2),*piVar15);
  pcVar8 = Extra_TimeStamp();
  fprintf(__stream,"// Design \"%s\" written by ABC on %s\n\n",pcVar7,pcVar8);
  if (0 < vPrs->nSize) {
    lVar9 = 0;
    do {
      p = (Prs_Ntk_t *)vPrs->pArray[lVar9];
      pcVar7 = Prs_ObjGetName(p,p->iModuleName);
      fprintf(__stream,"module %s (\n    ",pcVar7);
      if (0 < (p->vOrder).nSize) {
        uVar11 = 0;
        do {
          uVar6 = (p->vOrder).pArray[uVar11];
          if ((int)uVar6 < 0) {
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x11a,"int Abc_Lit2Var2(int)");
          }
          pcVar8 = Prs_ObjGetName(p,uVar6 >> 2);
          pcVar7 = "    \"%s\", ";
          if (uVar11 == (p->vOrder).nSize - 1) {
            pcVar7 = "T = %d\t\t";
          }
          fprintf(__stream,"%s%s",pcVar8,pcVar7 + 8);
          uVar11 = uVar11 + 1;
        } while ((long)uVar11 < (long)(p->vOrder).nSize);
      }
      fwrite("\n  );\n",6,1,__stream);
      auVar18._8_4_ = (int)p;
      auVar18._0_8_ = p;
      auVar18._12_4_ = (int)((ulong)p >> 0x20);
      lVar17 = auVar18._8_8_;
      lVar12 = 0;
      do {
        local_328 = &p->vInouts;
        lStack_320 = lVar17 + 0x40;
        local_318 = &p->vOutputs;
        lStack_310 = lVar17 + 0x60;
        local_338 = &p->vOutputsR;
        lStack_330 = lVar17 + 0xa0;
        local_348 = &p->vInoutsR;
        lStack_340 = lVar17 + 0x80;
        if (lVar12 == 3) {
          fputc(10,__stream);
        }
        pVVar2 = (&local_328)[lVar12];
        if (0 < pVVar2->nSize) {
          pVVar3 = (&local_348)[lVar12];
          lVar13 = 0;
          do {
            if (pVVar3->nSize <= lVar13) goto LAB_0034e214;
            uVar6 = pVVar3->pArray[lVar13];
            if ((int)uVar6 < 0) {
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10d,"int Abc_LitIsCompl(int)");
            }
            iVar10 = pVVar2->pArray[lVar13];
            iVar1 = *(int *)(&DAT_0084b0a4 + lVar12 * 4);
            pcVar7 = "signed ";
            if ((uVar6 & 1) == 0) {
              pcVar7 = "";
            }
            pcVar8 = "";
            if (uVar6 != 0) {
              uVar16 = 0;
              uVar14 = 0;
              if (uVar6 != 1) {
                pVVar4 = p->vHash->vObjs;
                uVar6 = uVar6 * 2 & 0x7ffffffc;
                if (pVVar4->nSize <= (int)uVar6) goto LAB_0034e252;
                piVar15 = pVVar4->pArray;
                uVar16 = piVar15[uVar6];
                uVar14 = piVar15[(ulong)uVar6 + 1];
              }
              p_00 = Abc_NamBuffer(p->pStrs);
              pcVar8 = Vec_StrPrintF(p_00,"[%d:%d]",(ulong)uVar16,(ulong)uVar14);
            }
            fprintf(__stream,"  %s %s%s",&DAT_0084b0a4 + iVar1,pcVar7,pcVar8);
            pcVar7 = Prs_ObjGetName(p,iVar10);
            fprintf(__stream,"%s;\n",pcVar7);
            lVar13 = lVar13 + 1;
          } while (lVar13 < pVVar2->nSize);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 4);
      fputc(10,__stream);
      if (0 < (p->vObjs).nSize) {
        lVar12 = 0;
        do {
          piVar15 = (p->vObjs).pArray;
          iVar10 = piVar15[lVar12];
          if (((long)iVar10 < 0) || (uVar6 = (p->vBoxes).nSize, (int)uVar6 <= iVar10)) {
LAB_0034e214:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar5 = (p->vBoxes).pArray;
          Prs_BoxSignals_V_1 = piVar5[iVar10] - 2;
          iVar10 = piVar15[lVar12];
          if ((iVar10 < -3) || (uVar6 <= iVar10 + 3U)) {
LAB_0034e252:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          Prs_BoxSignals_V_2 = piVar5 + (iVar10 + 3U);
          if ((((p->vObjs).nSize <= lVar12) || (iVar10 < -1)) || (uVar6 <= iVar10 + 1U))
          goto LAB_0034e214;
          uVar6 = piVar5[iVar10 + 1U];
          uVar11 = (ulong)uVar6;
          if (uVar11 == 0x12) {
            if (*Prs_BoxSignals_V_2 == 0) {
              if (Prs_BoxSignals_V_1 != 8) {
                __assert_fail("Vec_IntSize(vSigs) == 8",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                              ,0xdd,"void Prs_ManWriteVerilogMux(FILE *, Prs_Ntk_t *, Vec_Int_t *)")
                ;
              }
              fwrite("  assign ",9,1,__stream);
              if ((int)Prs_BoxSignals_V_1 < 2) goto LAB_0034e214;
              Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[1]);
              fputs(" = ",__stream);
              if (3 < (int)Prs_BoxSignals_V_1) {
                iVar10 = 3;
                lVar17 = 1;
                do {
                  Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[lVar17 * 2 + 1]);
                  fputs(&DAT_0084b0b4 +
                        *(int *)(&DAT_0084b0b4 + (ulong)((uint)lVar17 & 0x7fffffff) * 4),__stream);
                  iVar10 = iVar10 + 2;
                  lVar17 = lVar17 + 1;
                } while (iVar10 < (int)Prs_BoxSignals_V_1);
              }
            }
            else {
LAB_0034ddb3:
              pcVar7 = Prs_ObjGetName(p,uVar6);
              if ((((p->vObjs).nSize <= lVar12) || (iVar10 = (p->vObjs).pArray[lVar12], iVar10 < -2)
                  ) || (uVar6 = iVar10 + 2, (p->vBoxes).nSize <= (int)uVar6)) goto LAB_0034e214;
              iVar10 = (p->vBoxes).pArray[uVar6];
              pcVar8 = "";
              if (iVar10 != 0) {
                pcVar8 = Prs_ObjGetName(p,iVar10);
              }
              fprintf(__stream,"  %s %s ( ",pcVar7,pcVar8);
              if ((Prs_BoxSignals_V_1 & 1) != 0) {
                __assert_fail("Vec_IntSize(vSigs) % 2 == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cbaWriteVer.c"
                              ,0xcf,
                              "void Prs_ManWriteVerilogArray2(FILE *, Prs_Ntk_t *, Vec_Int_t *)");
              }
              if (1 < (int)Prs_BoxSignals_V_1) {
                lVar17 = 1;
                do {
                  iVar10 = Prs_BoxSignals_V_2[lVar17 + -1];
                  iVar1 = Prs_BoxSignals_V_2[lVar17];
                  fputc(0x2e,__stream);
                  pcVar7 = Prs_ObjGetName(p,iVar10);
                  fputs(pcVar7,__stream);
                  fputc(0x28,__stream);
                  Prs_ManWriteVerilogSignal((FILE *)__stream,p,iVar1);
                  pcVar7 = "    \"%s\", ";
                  if (lVar17 - 1U == (ulong)(Prs_BoxSignals_V_1 - 2)) {
                    pcVar7 = "T = %d\t\t";
                  }
                  fprintf(__stream,")%s",pcVar7 + 8);
                  lVar17 = lVar17 + 2;
                } while ((int)lVar17 < (int)Prs_BoxSignals_V_1);
              }
              fwrite(" );\n",4,1,__stream);
            }
          }
          else {
            if (*Prs_BoxSignals_V_2 != 0) goto LAB_0034ddb3;
            fwrite("  assign ",9,1,__stream);
            if ((int)Prs_BoxSignals_V_1 < 2) goto LAB_0034e214;
            Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[1]);
            fwrite(" = ",3,1,__stream);
            if (((uVar6 < 0x3a) && ((0x380000200000300U >> (uVar11 & 0x3f) & 1) != 0)) ||
               (0xfffffff9 < uVar6 - 0x21)) {
              fputs((char *)local_308[uVar11],__stream);
              lVar17 = 0xc;
              if ((int)Prs_BoxSignals_V_1 < 4) goto LAB_0034e214;
LAB_0034dfa6:
              Prs_ManWriteVerilogSignal
                        ((FILE *)__stream,p,*(int *)((long)Prs_BoxSignals_V_2 + lVar17));
            }
            else {
              if (uVar11 == 0x2f) {
                if (3 < (int)Prs_BoxSignals_V_1) {
                  if (Prs_BoxSignals_V_2[3] != 0) {
                    Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[3]);
                    fprintf(__stream," %s ","+");
                  }
                  if (5 < (int)Prs_BoxSignals_V_1) {
                    Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[5]);
                    fprintf(__stream," %s ","+");
                    lVar17 = 0x1c;
                    if (7 < (int)Prs_BoxSignals_V_1) goto LAB_0034dfa6;
                  }
                }
                goto LAB_0034e214;
              }
              if (uVar6 != 0x28) {
                if (3 < (int)Prs_BoxSignals_V_1) {
                  Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[3]);
                  fprintf(__stream," %s ",local_308[uVar11]);
                  lVar17 = 0x14;
                  if (5 < (int)Prs_BoxSignals_V_1) goto LAB_0034dfa6;
                }
                goto LAB_0034e214;
              }
              if ((int)Prs_BoxSignals_V_1 < 4) goto LAB_0034e214;
              Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[3]);
              fwrite(" ? ",3,1,__stream);
              if (5 < (int)Prs_BoxSignals_V_1) {
                uVar11 = 5;
                do {
                  if (5 < uVar11) {
                    fwrite(" : ",3,1,__stream);
                  }
                  if ((long)(int)Prs_BoxSignals_V_1 <= (long)uVar11) goto LAB_0034e214;
                  Prs_ManWriteVerilogSignal((FILE *)__stream,p,Prs_BoxSignals_V_2[uVar11]);
                  uVar11 = uVar11 + 2;
                } while ((int)uVar11 < (int)Prs_BoxSignals_V_1);
              }
            }
            fwrite(";\n",2,1,__stream);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < (p->vObjs).nSize);
      }
      fwrite("endmodule\n\n",0xb,1,__stream);
      lVar9 = lVar9 + 1;
    } while (lVar9 < vPrs->nSize);
  }
  fclose(__stream);
  return;
}

Assistant:

void Prs_ManWriteVerilog( char * pFileName, Vec_Ptr_t * vPrs )
{
    char * pTypeNames[CBA_BOX_LAST];
    Prs_Ntk_t * pNtk = Prs_ManRoot(vPrs); int i;
    FILE * pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open output file \"%s\".\n", pFileName );
        return;
    }
    Cba_ManCreatePrimMap( pTypeNames );
    fprintf( pFile, "// Design \"%s\" written by ABC on %s\n\n", Prs_NtkStr(pNtk, pNtk->iModuleName), Extra_TimeStamp() );
    Vec_PtrForEachEntry( Prs_Ntk_t *, vPrs, pNtk, i )
        Prs_ManWriteVerilogNtk( pFile, pNtk, pTypeNames );
    fclose( pFile );
}